

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateCopy(z_streamp dest,z_streamp source)

{
  void *__src;
  undefined8 *__dest;
  undefined8 uVar1;
  long lVar2;
  void *in_RSI;
  void *in_RDI;
  ushf *overlay;
  deflate_state *ss;
  deflate_state *ds;
  z_streamp in_stack_ffffffffffffffc8;
  int local_4;
  
  if (((in_RSI == (void *)0x0) || (in_RDI == (void *)0x0)) || (*(long *)((long)in_RSI + 0x38) == 0))
  {
    local_4 = -2;
  }
  else {
    __src = *(void **)((long)in_RSI + 0x38);
    memcpy(in_RDI,in_RSI,0x70);
    __dest = (undefined8 *)
             (**(code **)((long)in_RDI + 0x40))(*(undefined8 *)((long)in_RDI + 0x50),1,0x1728);
    if (__dest == (undefined8 *)0x0) {
      local_4 = -4;
    }
    else {
      *(undefined8 **)((long)in_RDI + 0x38) = __dest;
      memcpy(__dest,__src,0x1728);
      *__dest = in_RDI;
      uVar1 = (**(code **)((long)in_RDI + 0x40))
                        (*(undefined8 *)((long)in_RDI + 0x50),*(undefined4 *)((long)__dest + 0x44),2
                        );
      __dest[10] = uVar1;
      uVar1 = (**(code **)((long)in_RDI + 0x40))
                        (*(undefined8 *)((long)in_RDI + 0x50),*(undefined4 *)((long)__dest + 0x44),2
                        );
      __dest[0xc] = uVar1;
      uVar1 = (**(code **)((long)in_RDI + 0x40))
                        (*(undefined8 *)((long)in_RDI + 0x50),*(undefined4 *)((long)__dest + 0x74),2
                        );
      __dest[0xd] = uVar1;
      lVar2 = (**(code **)((long)in_RDI + 0x40))
                        (*(undefined8 *)((long)in_RDI + 0x50),*(undefined4 *)(__dest + 0x2df),4);
      __dest[2] = lVar2;
      if (((__dest[10] == 0) || (__dest[0xc] == 0)) || ((__dest[0xd] == 0 || (__dest[2] == 0)))) {
        deflateEnd(in_stack_ffffffffffffffc8);
        local_4 = -4;
      }
      else {
        memcpy((void *)__dest[10],*(void **)((long)__src + 0x50),
               (ulong)(uint)(*(int *)((long)__dest + 0x44) << 1));
        memcpy((void *)__dest[0xc],*(void **)((long)__src + 0x60),
               (ulong)*(uint *)((long)__dest + 0x44) << 1);
        memcpy((void *)__dest[0xd],*(void **)((long)__src + 0x68),
               (ulong)*(uint *)((long)__dest + 0x74) << 1);
        memcpy((void *)__dest[2],*(void **)((long)__src + 0x10),__dest[3] & 0xffffffff);
        __dest[4] = __dest[2] + (*(long *)((long)__src + 0x20) - *(long *)((long)__src + 0x10));
        __dest[0x2e0] = lVar2 + (ulong)(*(uint *)(__dest + 0x2df) >> 1) * 2;
        __dest[0x2de] = __dest[2] + (ulong)*(uint *)(__dest + 0x2df) * 3;
        __dest[0x169] = (long)__dest + 0xc4;
        __dest[0x16c] = __dest + 0x137;
        __dest[0x16f] = (long)__dest + 0xaac;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ZEXPORT deflateCopy (dest, source)
    z_streamp dest;
    z_streamp source;
{
#ifdef MAXSEG_64K
    return Z_STREAM_ERROR;
#else
    deflate_state *ds;
    deflate_state *ss;
    ushf *overlay;


    if (source == Z_NULL || dest == Z_NULL || source->state == Z_NULL) {
        return Z_STREAM_ERROR;
    }

    ss = source->state;

    zmemcpy(dest, source, sizeof(z_stream));

    ds = (deflate_state *) ZALLOC(dest, 1, sizeof(deflate_state));
    if (ds == Z_NULL) return Z_MEM_ERROR;
    dest->state = (struct internal_state FAR *) ds;
    zmemcpy(ds, ss, sizeof(deflate_state));
    ds->strm = dest;

    ds->window = (Bytef *) ZALLOC(dest, ds->w_size, 2*sizeof(Byte));
    ds->prev   = (Posf *)  ZALLOC(dest, ds->w_size, sizeof(Pos));
    ds->head   = (Posf *)  ZALLOC(dest, ds->hash_size, sizeof(Pos));
    overlay = (ushf *) ZALLOC(dest, ds->lit_bufsize, sizeof(ush)+2);
    ds->pending_buf = (uchf *) overlay;

    if (ds->window == Z_NULL || ds->prev == Z_NULL || ds->head == Z_NULL ||
        ds->pending_buf == Z_NULL) {
        deflateEnd (dest);
        return Z_MEM_ERROR;
    }
    /* following zmemcpy do not work for 16-bit MSDOS */
    zmemcpy(ds->window, ss->window, ds->w_size * 2 * sizeof(Byte));
    zmemcpy(ds->prev, ss->prev, ds->w_size * sizeof(Pos));
    zmemcpy(ds->head, ss->head, ds->hash_size * sizeof(Pos));
    zmemcpy(ds->pending_buf, ss->pending_buf, (uInt)ds->pending_buf_size);

    ds->pending_out = ds->pending_buf + (ss->pending_out - ss->pending_buf);
    ds->d_buf = overlay + ds->lit_bufsize/sizeof(ush);
    ds->l_buf = ds->pending_buf + (1+sizeof(ush))*ds->lit_bufsize;

    ds->l_desc.dyn_tree = ds->dyn_ltree;
    ds->d_desc.dyn_tree = ds->dyn_dtree;
    ds->bl_desc.dyn_tree = ds->bl_tree;

    return Z_OK;
#endif /* MAXSEG_64K */
}